

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TexImageCubeAlignCase::createTexture(TexImageCubeAlignCase *this)

{
  deUint32 target;
  deUint32 format;
  deUint32 type;
  int iVar1;
  int iVar2;
  int rowPitch_00;
  int y;
  reference pvVar3;
  int local_b4;
  int local_a4;
  int face;
  int local_78;
  undefined1 local_74 [4];
  int cellSize;
  Vec4 colorB;
  Vec4 colorA;
  int rowPitch;
  int levelH;
  int levelW;
  int ndx;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  int numLevels;
  TextureFormat fmt;
  TexImageCubeAlignCase *this_local;
  
  _tex = (this->super_TextureSpecCase).m_texFormat;
  fmt = (TextureFormat)this;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_b4 = 1;
  }
  else {
    iVar1 = ::deLog2Floor32((this->super_TextureSpecCase).m_width);
    iVar2 = ::deLog2Floor32((this->super_TextureSpecCase).m_height);
    local_b4 = de::max<int>(iVar1,iVar2);
    local_b4 = local_b4 + 1;
  }
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = local_b4;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureSpecCase).super_ContextWrapper,1,
             (deUint32 *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureSpecCase).super_ContextWrapper,0x8513,
             (deUint32)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,this->m_alignment);
  for (levelH = 0;
      levelH < data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_; levelH = levelH + 1) {
    iVar1 = de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH & 0x1f));
    iVar2 = de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH & 0x1f));
    rowPitch_00 = getRowPitch((TextureFormat *)&tex,iVar1,this->m_alignment);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_74,0.0,1.0,0.0,1.0);
    y = de::min<int>(iVar1 >> 2,iVar2 >> 2);
    local_78 = de::max<int>(1,y);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
               (long)(rowPitch_00 * iVar2));
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&stack0xffffffffffffff60,(TextureFormat *)&tex,iVar1,iVar2,1,
               rowPitch_00,0,pvVar3);
    tcu::fillWithGrid((PixelBufferAccess *)&stack0xffffffffffffff60,local_78,
                      (Vec4 *)(colorB.m_data + 2),(Vec4 *)local_74);
    for (local_a4 = 0; local_a4 < 6; local_a4 = local_a4 + 1) {
      target = *(deUint32 *)(s_cubeMapFaces + (long)local_a4 * 4);
      format = this->m_format;
      type = this->m_dataType;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
      sglr::ContextWrapper::glTexImage2D
                (&(this->super_TextureSpecCase).super_ContextWrapper,target,levelH,format,iVar1,
                 iVar2,0,format,type,pvVar3);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		vector<deUint8>		data;

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		rowPitch	= getRowPitch(fmt, levelW, m_alignment);
			Vec4	colorA		(1.0f, 0.0f, 0.0f, 1.0f);
			Vec4	colorB		(0.0f, 1.0f, 0.0f, 1.0f);
			int		cellSize	= de::max(1, de::min(levelW >> 2, levelH >> 2));

			data.resize(rowPitch*levelH);
			tcu::fillWithGrid(tcu::PixelBufferAccess(fmt, levelW, levelH, 1, rowPitch, 0, &data[0]), cellSize, colorA, colorB);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, &data[0]);
		}
	}